

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(char lhs,SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  int iVar1;
  char ret;
  char local_e;
  char local_d;
  int local_c;
  
  iVar1 = 0x80;
  if (lhs != -0x80 || rhs.m_int != -1) {
    local_d = '\0';
    local_e = lhs;
    local_c = rhs.m_int;
    DivisionHelper<signed_char,_int,_5>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_e,&local_c,&local_d);
    iVar1 = (int)local_d;
  }
  return (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)iVar1;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}